

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OSubstractAndAssign
          (_Type_CLASS_OBJECT *this,Variable *object_target,Variable *object_src)

{
  State *state;
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar3;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Variable v;
  undefined1 local_68 [16];
  pointer local_58;
  pointer *local_50;
  Variable local_40;
  
  pOVar2 = Variable::operator->(object_src);
  Class::GetOperator((Class *)&stack0xffffffffffffffd0,
                     (OperatorType)*(undefined8 *)((long)pOVar2->data + 0x38));
  pOVar2 = Variable::operator->((Variable *)&stack0xffffffffffffffd0);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator==(this_00,(Type *)_type_callback);
  if (bVar1) {
    pOVar2 = Variable::operator->(object_src);
    if (*(long *)((long)pOVar2->data + 0x40) != 0) {
      pOVar2 = Variable::operator->((Variable *)&stack0xffffffffffffffd0);
      state = (State *)pOVar2->data;
      local_50 = &local_58;
      local_58 = (pointer)((ulong)local_58 & 0xffffffffffffff00);
      Variable::Variable((Variable *)local_68,object_src);
      Nullable<LiteScript::Variable>::operator=
                ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                 (Nullable<LiteScript::Variable> *)local_68);
      if (local_58._0_1_ == false) {
        Variable::~Variable((Variable *)local_68);
      }
      local_68._0_8_ = (Object *)0x0;
      local_68._8_8_ = (pointer)0x0;
      local_58 = (pointer)0x0;
      Variable::Variable(&local_40,in_RCX);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_68,
                 &local_40);
      Variable::~Variable(&local_40);
      pOVar2 = Variable::operator->(object_src);
      Callback::operator()
                ((Callback *)this,state,
                 *(vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> **)
                  ((long)pOVar2->data + 0x40));
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_68);
      goto LAB_0012885c;
    }
  }
  pOVar2 = Variable::operator->(object_src);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
LAB_0012885c:
  Variable::~Variable((Variable *)&stack0xffffffffffffffd0);
  VVar3.nb_ref = extraout_RDX;
  VVar3.obj = (Object *)this;
  return VVar3;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OSubstractAndAssign(Variable& object_target, const Variable& object_src) const {
    Variable v = object_target->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_SUB_ASSIGN);
    if (v->GetType() == Type::CALLBACK) {
        if (object_target->GetData<ClassObject>().ScriptState == nullptr)
            return object_target->memory.Create(Type::NIL);
        Callback &call = v->GetData<Callback>();
        call.This = Nullable<Variable>(object_target);
        std::vector<Variable> args;
        args.push_back(Variable(object_src));
        return call(*(object_target->GetData<ClassObject>().ScriptState), args);
    }
    else {
        return object_target->memory.Create(Type::NIL);
    }
}